

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O3

size_t absl::lts_20240722::cord_internal::GetEstimatedFairShareMemoryUsage
                 (Nonnull<const_CordRep_*> rep)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> *in_RDX;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> raw_usage;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> local_8;
  
  local_8.total = 0.0;
  iVar1 = (rep->refcount).count_.super___atomic_base<int>._M_i;
  iVar3 = iVar1 >> 1;
  auVar5._8_4_ = iVar1 >> 0x1f;
  auVar5._0_8_ = (long)iVar3;
  auVar5._12_4_ = 0x45300000;
  dVar4 = 1.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
  bVar2 = rep->tag;
  if (bVar2 == 2) {
    local_8.total = dVar4 * 32.0 + 0.0;
    rep = (Nonnull<const_CordRep_*>)rep[1].length;
    if (rep == (Nonnull<const_CordRep_*>)0x0) goto LAB_00113f67;
    iVar1 = (rep->refcount).count_.super___atomic_base<int>._M_i;
    iVar3 = iVar1 >> 1;
    auVar6._8_4_ = iVar1 >> 0x1f;
    auVar6._0_8_ = (long)iVar3;
    auVar6._12_4_ = 0x45300000;
    dVar4 = dVar4 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
    bVar2 = rep->tag;
  }
  if (bVar2 < 5) {
    if (bVar2 == 3) {
      rep_01.fraction = dVar4;
      rep_01.rep = rep;
      anon_unknown_0::
      AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
                (rep_01,&stack0xfffffffffffffff8);
      goto LAB_00113f67;
    }
    if ((bVar2 != 1) || (*(byte *)(*(long *)&rep[1].refcount + 0xc) < 5)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                   );
    }
  }
  rep_00.fraction = dVar4;
  rep_00.rep = (Nonnull<const_CordRep_*>)&stack0xfffffffffffffff8;
  anon_unknown_0::AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
            ((anon_unknown_0 *)rep,rep_00,in_RDX);
LAB_00113f67:
  return (long)(local_8.total - 9.223372036854776e+18) & (long)local_8.total >> 0x3f |
         (long)local_8.total;
}

Assistant:

size_t GetEstimatedFairShareMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kFairShare>(rep);
}